

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CriticalSectionsBuilder.cpp
# Opt level: O1

set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
* __thiscall
CriticalSectionsBuilder::correspondingUnlocks
          (set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
           *__return_storage_ptr__,CriticalSectionsBuilder *this,CallInst *lock)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  
  if (lock != (CallInst *)0x0) {
    p_Var3 = &(this->criticalSections_)._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = (this->criticalSections_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var1 = &p_Var3->_M_header;
    for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[*(CallInst **)(p_Var2 + 1) < lock])
    {
      if (*(CallInst **)(p_Var2 + 1) >= lock) {
        p_Var1 = p_Var2;
      }
    }
    p_Var2 = &p_Var3->_M_header;
    if (((_Rb_tree_header *)p_Var1 != p_Var3) &&
       (p_Var2 = p_Var1, lock < *(CallInst **)(p_Var1 + 1))) {
      p_Var2 = &p_Var3->_M_header;
    }
    if ((_Rb_tree_header *)p_Var2 != p_Var3) {
      CriticalSection::unlocks(__return_storage_ptr__,(CriticalSection *)p_Var2[1]._M_parent);
      return __return_storage_ptr__;
    }
  }
  p_Var3 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
  *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var3->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var3->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  return __return_storage_ptr__;
}

Assistant:

std::set<const llvm::CallInst *> CriticalSectionsBuilder::correspondingUnlocks(
        const llvm::CallInst *lock) const {
    if (!lock) {
        return {};
    }
    auto iterator = criticalSections_.find(lock);
    if (iterator != criticalSections_.end()) {
        return iterator->second->unlocks();
    }
    return {};
}